

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void arena_tcache_fill_small
               (tsdn_t *tsdn,arena_t *arena,tcache_t *tcache,cache_bin_t *tbin,szind_t binind,
               uint64_t prof_accumbytes)

{
  uint64_t *puVar1;
  int iVar2;
  extent_t *peVar3;
  void **ppvVar4;
  size_t sVar5;
  bool bVar6;
  tsd_t *tsdn_00;
  uint uVar7;
  bin_t *bin;
  void *pvVar8;
  arena_tdata_t *paVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  bitmap_t bVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint binshard;
  long local_50;
  tsd_t *local_48;
  long local_40;
  bin_info_t *local_38;
  
  local_48 = &tsdn->tsd;
  bin = arena_bin_choose_lock(tsdn,arena,binind,&binshard);
  uVar14 = tcache_bin_info[binind].ncached_max >> (tcache->lg_fill_div[binind] & 0x1f);
  if (uVar14 == 0) {
    uVar18 = 0;
  }
  else {
    local_38 = bin_infos + binind;
    local_40 = -(ulong)uVar14;
    uVar18 = 0;
    local_50 = (ulong)uVar14 * -8;
    do {
      peVar3 = bin->slabcur;
      uVar17 = (uint)uVar18;
      if ((peVar3 == (extent_t *)0x0) ||
         (uVar11 = peVar3->e_bits >> 0x1a, uVar10 = (uint)uVar11 & 0x3ff, (uVar11 & 0x3ff) == 0)) {
        pvVar8 = arena_bin_malloc_hard((tsdn_t *)local_48,arena,bin,binind,binshard);
        bVar6 = pvVar8 != (void *)0x0;
        if (pvVar8 == (void *)0x0) {
          if (uVar17 != 0) {
            memmove(tbin->avail + -uVar18,tbin->avail + local_40,uVar18 * 8);
          }
        }
        else {
          *(void **)((long)tbin->avail + uVar18 * 8 + local_50) = pvVar8;
        }
        uVar7 = 1;
      }
      else {
        uVar7 = uVar14 - uVar17;
        if (uVar10 <= uVar14 - uVar17) {
          uVar7 = uVar10;
        }
        if (uVar14 != uVar17) {
          ppvVar4 = tbin->avail;
          bVar16 = (peVar3->field_5).e_slab_data.bitmap[0];
          uVar11 = 0;
          uVar15 = 0;
          do {
            while (bVar16 == 0) {
              uVar11 = (ulong)((int)uVar11 + 1);
              bVar16 = *(ulong *)((long)&peVar3->field_5 + uVar11 * 8);
            }
            uVar10 = uVar7 - (int)uVar15;
            if (uVar10 != 0) {
              pvVar8 = peVar3->e_addr;
              sVar5 = local_38->reg_size;
              uVar19 = bVar16 - (bVar16 >> 1 & 0x5555555555555555);
              uVar19 = (uVar19 >> 2 & 0x3333333333333333) + (uVar19 & 0x3333333333333333);
              uVar12 = (uint)(byte)(((uVar19 >> 4) + uVar19 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                   >> 0x38);
              if (uVar10 < uVar12) {
                uVar12 = uVar10;
              }
              lVar13 = -(ulong)uVar12;
              do {
                uVar19 = 0;
                if (bVar16 != 0) {
                  for (; (bVar16 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                if (bVar16 == 0) {
                  uVar19 = 0xffffffff;
                }
                bVar16 = bVar16 ^ 1L << (uVar19 & 0x3f);
                *(void **)((long)ppvVar4 + uVar15 * 8 + uVar18 * 8 + local_50) =
                     (void *)((uVar19 + (uint)((int)uVar11 << 6)) * sVar5 + (long)pvVar8);
                uVar15 = (ulong)((int)uVar15 + 1);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 0);
            }
            *(bitmap_t *)((long)&peVar3->field_5 + uVar11 * 8) = bVar16;
          } while ((uint)uVar15 < uVar7);
        }
        peVar3->e_bits = peVar3->e_bits + (ulong)uVar7 * -0x4000000;
        bVar6 = true;
      }
    } while ((bVar6) && (uVar18 = (ulong)(uVar17 + uVar7), uVar17 + uVar7 < uVar14));
  }
  (bin->stats).nmalloc = (bin->stats).nmalloc + uVar18;
  puVar1 = &(bin->stats).nrequests;
  *puVar1 = *puVar1 + (tbin->tstats).nrequests;
  (bin->stats).curregs = uVar18 + (bin->stats).curregs;
  (bin->stats).nfills = (bin->stats).nfills + 1;
  (tbin->tstats).nrequests = 0;
  (bin->lock).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40));
  tsdn_00 = local_48;
  tbin->ncached = (cache_bin_sz_t)uVar18;
  if (local_48 != (tsd_t *)0x0) {
    uVar14 = arena->base->ind;
    if ((local_48->cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata ==
         (arena_tdata_t *)0x0) ||
       (local_48->cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata <= uVar14)) {
      paVar9 = arena_tdata_get_hard(local_48,uVar14);
    }
    else {
      paVar9 = local_48->cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata + uVar14
      ;
    }
    if ((paVar9 != (arena_tdata_t *)0x0) &&
       (iVar2 = (paVar9->decay_ticker).tick, (paVar9->decay_ticker).tick = iVar2 + -1, iVar2 < 1)) {
      (paVar9->decay_ticker).tick = (paVar9->decay_ticker).nticks;
      arena_decay((tsdn_t *)tsdn_00,arena,false,false);
      return;
    }
  }
  return;
}

Assistant:

void
arena_tcache_fill_small(tsdn_t *tsdn, arena_t *arena, tcache_t *tcache,
    cache_bin_t *tbin, szind_t binind, uint64_t prof_accumbytes) {
	unsigned i, nfill, cnt;

	assert(tbin->ncached == 0);

	if (config_prof && arena_prof_accum(tsdn, arena, prof_accumbytes)) {
		prof_idump(tsdn);
	}

	unsigned binshard;
	bin_t *bin = arena_bin_choose_lock(tsdn, arena, binind, &binshard);

	for (i = 0, nfill = (tcache_bin_info[binind].ncached_max >>
	    tcache->lg_fill_div[binind]); i < nfill; i += cnt) {
		extent_t *slab;
		if ((slab = bin->slabcur) != NULL && extent_nfree_get(slab) >
		    0) {
			unsigned tofill = nfill - i;
			cnt = tofill < extent_nfree_get(slab) ?
				tofill : extent_nfree_get(slab);
			arena_slab_reg_alloc_batch(
			   slab, &bin_infos[binind], cnt,
			   tbin->avail - nfill + i);
		} else {
			cnt = 1;
			void *ptr = arena_bin_malloc_hard(tsdn, arena, bin,
			    binind, binshard);
			/*
			 * OOM.  tbin->avail isn't yet filled down to its first
			 * element, so the successful allocations (if any) must
			 * be moved just before tbin->avail before bailing out.
			 */
			if (ptr == NULL) {
				if (i > 0) {
					memmove(tbin->avail - i,
						tbin->avail - nfill,
						i * sizeof(void *));
				}
				break;
			}
			/* Insert such that low regions get used first. */
			*(tbin->avail - nfill + i) = ptr;
		}
		if (config_fill && unlikely(opt_junk_alloc)) {
			for (unsigned j = 0; j < cnt; j++) {
				void* ptr = *(tbin->avail - nfill + i + j);
				arena_alloc_junk_small(ptr, &bin_infos[binind],
							true);
			}
		}
	}
	if (config_stats) {
		bin->stats.nmalloc += i;
		bin->stats.nrequests += tbin->tstats.nrequests;
		bin->stats.curregs += i;
		bin->stats.nfills++;
		tbin->tstats.nrequests = 0;
	}
	malloc_mutex_unlock(tsdn, &bin->lock);
	tbin->ncached = i;
	arena_decay_tick(tsdn, arena);
}